

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_multi_statemach(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  ulong in_RAX;
  _Bool ssldone;
  undefined8 uStack_28;
  
  pcVar1 = data->conn;
  uStack_28 = in_RAX;
  if (((pcVar1->handler->flags & 1) != 0) && ((*(byte *)((long)&pcVar1->proto + 0xd0) & 1) == 0)) {
    uStack_28 = in_RAX & 0xffffffffffffff;
    CVar2 = Curl_conn_connect(data,0,false,(_Bool *)((long)&uStack_28 + 7));
    *(byte *)((long)&pcVar1->proto + 0xd0) =
         *(byte *)((long)&pcVar1->proto + 0xd0) & 0xfe | uStack_28._7_1_;
    if (uStack_28._7_1_ == 0 || CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  CVar2 = Curl_pp_statemach(data,&(pcVar1->proto).ftpc.pp,false,false);
  *done = (pcVar1->proto).smtpc.state == SMTP_STOP;
  return CVar2;
}

Assistant:

static CURLcode smtp_multi_statemach(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  if((conn->handler->flags & PROTOPT_SSL) && !smtpc->ssldone) {
    bool ssldone = FALSE;
    result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
    smtpc->ssldone = ssldone;
    if(result || !smtpc->ssldone)
      return result;
  }

  result = Curl_pp_statemach(data, &smtpc->pp, FALSE, FALSE);
  *done = (smtpc->state == SMTP_STOP) ? TRUE : FALSE;

  return result;
}